

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O0

void __thiscall ObjectFileDB::find_code(ObjectFileDB *this)

{
  uint32_t total_ops;
  Timer timer;
  Stats combined_stats;
  ObjectFileDB *in_stack_ffffffffffffffb8;
  anon_class_8_1_6ea51d23 in_stack_ffffffffffffffc0;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  uint local_10;
  uint local_c;
  
  printf("- Finding code in object files...\n");
  LinkedObjectFile::Stats::Stats((Stats *)&stack0xffffffffffffffa0);
  Timer::Timer((Timer *)0x193d76);
  for_each_obj<ObjectFileDB::find_code()::__0>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
  printf("Found code:\n");
  printf(" code %.3f MB\n",(double)((float)local_1c * 9.536743e-07));
  printf(" data %.3f MB\n",(double)((float)local_20 * 9.536743e-07));
  printf(" functions: %d\n",(ulong)local_18);
  printf(" fp uses resolved: %d / %d (%.3f %%)\n",
         (double)(((float)local_c * 100.0) / (float)local_10),(ulong)local_c,(ulong)local_10);
  printf(" decoded %d / %d (%.3f %%)\n",(double)(((float)local_14 * 100.0) / (float)(local_1c >> 2))
         ,(ulong)local_14,(ulong)(local_1c >> 2));
  Timer::getMs((Timer *)0x193ea5);
  printf(" total %.3f ms\n");
  printf("\n");
  return;
}

Assistant:

void ObjectFileDB::find_code() {
  printf("- Finding code in object files...\n");
  LinkedObjectFile::Stats combined_stats;
  Timer timer;

  for_each_obj([&](ObjectFileData& obj) {
    //      printf("fc %s\n", obj.record.to_unique_name().c_str());
    obj.linked_data.find_code();
    obj.linked_data.find_functions();
    obj.linked_data.disassemble_functions();

    if (get_config().game_version == 1 || obj.record.to_unique_name() != "effect-control-v0") {
      obj.linked_data.process_fp_relative_links();
    } else {
      printf("skipping process_fp_relative_links in %s\n", obj.record.to_unique_name().c_str());
    }

    auto& obj_stats = obj.linked_data.stats;
    if (obj_stats.code_bytes / 4 > obj_stats.decoded_ops) {
      printf("Failed to decode all in %s (%d / %d)\n", obj.record.to_unique_name().c_str(),
             obj_stats.decoded_ops, obj_stats.code_bytes / 4);
    }
    combined_stats.add(obj.linked_data.stats);
  });

  printf("Found code:\n");
  printf(" code %.3f MB\n", combined_stats.code_bytes / (float)(1 << 20));
  printf(" data %.3f MB\n", combined_stats.data_bytes / (float)(1 << 20));
  printf(" functions: %d\n", combined_stats.function_count);
  printf(" fp uses resolved: %d / %d (%.3f %%)\n", combined_stats.n_fp_reg_use_resolved,
         combined_stats.n_fp_reg_use,
         100.f * (float)combined_stats.n_fp_reg_use_resolved / combined_stats.n_fp_reg_use);
  auto total_ops = combined_stats.code_bytes / 4;
  printf(" decoded %d / %d (%.3f %%)\n", combined_stats.decoded_ops, total_ops,
         100.f * (float)combined_stats.decoded_ops / total_ops);
  printf(" total %.3f ms\n", timer.getMs());
  printf("\n");
}